

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::ArrayReverseMethod::checkArguments
          (ArrayReverseMethod *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_5)

{
  bool bVar1;
  Compilation *this_00;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RDX;
  Expression *in_R9;
  Args *unaff_retaddr;
  bool in_stack_0000000f;
  ASTContext *in_stack_00000010;
  SystemSubroutine *in_stack_00000018;
  SourceRange in_stack_00000020;
  Compilation *comp;
  undefined8 local_8;
  
  this_00 = ASTContext::getCompilation((ASTContext *)0x92a2c6);
  bVar1 = SystemSubroutine::checkArgCount
                    (in_stack_00000018,in_stack_00000010,in_stack_0000000f,unaff_retaddr,
                     in_stack_00000020,(size_t)context,(size_t)this);
  if (bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
    bVar1 = SystemSubroutine::registerLValue(in_R9,(ASTContext *)this_00);
    if (bVar1) {
      local_8 = Compilation::getVoidType(this_00);
    }
    else {
      local_8 = Compilation::getErrorType(this_00);
    }
  }
  else {
    local_8 = Compilation::getErrorType(this_00);
  }
  return local_8;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, true, args, range, 0, 0))
            return comp.getErrorType();

        if (!registerLValue(*args[0], context))
            return comp.getErrorType();

        return comp.getVoidType();
    }